

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_root.c
# Opt level: O0

int arkRootCheck1(void *arkode_mem)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  long in_RDI;
  double dVar4;
  ARKodeRootMem rootmem;
  ARKodeMem ark_mem;
  int zroot;
  sunrealtype tplus;
  sunrealtype hratio;
  sunrealtype smallh;
  int retval;
  int i;
  double local_50;
  int local_14;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x1a5,"arkRootCheck1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_root.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    puVar1 = *(undefined8 **)(in_RDI + 0x3a0);
    for (local_14 = 0; local_14 < *(int *)(puVar1 + 1); local_14 = local_14 + 1) {
      *(undefined4 *)(puVar1[2] + (long)local_14 * 4) = 0;
    }
    puVar1[4] = *(undefined8 *)(in_RDI + 0x2d0);
    puVar1[0xb] = (ABS(*(double *)(in_RDI + 0x2d0)) + ABS(*(double *)(in_RDI + 0x2a0))) *
                  *(double *)(in_RDI + 8) * 100.0;
    iVar3 = (*(code *)*puVar1)(puVar1[4],*(undefined8 *)(in_RDI + 0x230),puVar1[7],puVar1[0x10]);
    puVar1[0xd] = 1;
    if (iVar3 == 0) {
      bVar2 = false;
      for (local_14 = 0; local_14 < *(int *)(puVar1 + 1); local_14 = local_14 + 1) {
        dVar4 = ABS(*(double *)(puVar1[7] + (long)local_14 * 8));
        if ((dVar4 == 0.0) && (!NAN(dVar4))) {
          bVar2 = true;
          *(undefined4 *)(puVar1[0xe] + (long)local_14 * 4) = 0;
        }
      }
      if (bVar2) {
        if ((double)puVar1[0xb] / ABS(*(double *)(in_RDI + 0x2a0)) <= 0.1) {
          local_50 = 0.1;
        }
        else {
          local_50 = (double)puVar1[0xb] / ABS(*(double *)(in_RDI + 0x2a0));
        }
        local_50 = local_50 * *(double *)(in_RDI + 0x2a0);
        dVar4 = (double)puVar1[4];
        N_VLinearSum(0x3ff0000000000000,local_50,*(undefined8 *)(in_RDI + 0x230),
                     *(undefined8 *)(in_RDI + 0x238),*(undefined8 *)(in_RDI + 0x228));
        iVar3 = (*(code *)*puVar1)(dVar4 + local_50,*(undefined8 *)(in_RDI + 0x228),puVar1[8],
                                   puVar1[0x10]);
        puVar1[0xd] = puVar1[0xd] + 1;
        if (iVar3 == 0) {
          for (local_14 = 0; local_14 < *(int *)(puVar1 + 1); local_14 = local_14 + 1) {
            if ((*(int *)(puVar1[0xe] + (long)local_14 * 4) == 0) &&
               ((dVar4 = ABS(*(double *)(puVar1[8] + (long)local_14 * 8)), dVar4 != 0.0 ||
                (NAN(dVar4))))) {
              *(undefined4 *)(puVar1[0xe] + (long)local_14 * 4) = 1;
              *(undefined8 *)(puVar1[7] + (long)local_14 * 8) =
                   *(undefined8 *)(puVar1[8] + (long)local_14 * 8);
            }
          }
          local_4 = 0;
        }
        else {
          local_4 = -0xc;
        }
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = -0xc;
    }
  }
  return local_4;
}

Assistant:

int arkRootCheck1(void* arkode_mem)
{
  int i, retval;
  sunrealtype smallh, hratio, tplus;
  sunbooleantype zroot;
  ARKodeMem ark_mem;
  ARKodeRootMem rootmem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;
  rootmem = ark_mem->root_mem;

  for (i = 0; i < rootmem->nrtfn; i++) { rootmem->iroots[i] = 0; }
  rootmem->tlo  = ark_mem->tcur;
  rootmem->ttol = (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->h)) *
                  ark_mem->uround * HUND;

  /* Evaluate g at initial t and check for zero values. */
  retval       = rootmem->gfun(rootmem->tlo, ark_mem->yn, rootmem->glo,
                               rootmem->root_data);
  rootmem->nge = 1;
  if (retval != 0) { return (ARK_RTFUNC_FAIL); }

  zroot = SUNFALSE;
  for (i = 0; i < rootmem->nrtfn; i++)
  {
    if (SUNRabs(rootmem->glo[i]) == ZERO)
    {
      zroot               = SUNTRUE;
      rootmem->gactive[i] = SUNFALSE;
    }
  }
  if (!zroot) { return (ARK_SUCCESS); }

  /* Some g_i is zero at t0; look at g at t0+(small increment). */
  hratio = SUNMAX(rootmem->ttol / SUNRabs(ark_mem->h), TENTH);
  smallh = hratio * ark_mem->h;
  tplus  = rootmem->tlo + smallh;
  N_VLinearSum(ONE, ark_mem->yn, smallh, ark_mem->fn, ark_mem->ycur);
  retval = rootmem->gfun(tplus, ark_mem->ycur, rootmem->ghi, rootmem->root_data);
  rootmem->nge++;
  if (retval != 0) { return (ARK_RTFUNC_FAIL); }

  /* We check now only the components of g which were exactly 0.0 at t0
   * to see if we can 'activate' them. */
  for (i = 0; i < rootmem->nrtfn; i++)
  {
    if (!rootmem->gactive[i] && SUNRabs(rootmem->ghi[i]) != ZERO)
    {
      rootmem->gactive[i] = SUNTRUE;
      rootmem->glo[i]     = rootmem->ghi[i];
    }
  }
  return (ARK_SUCCESS);
}